

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::sampleNearest2D
          (tcu *this,ConstPixelBufferAccess *access,Sampler *sampler,float u,float v,IVec3 *offset)

{
  uint uVar1;
  int i;
  TextureChannelClass TVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  Vector<float,_4> *res;
  uint uVar6;
  uint uVar7;
  uint j;
  uint uVar8;
  float fVar9;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float fVar10;
  undefined4 in_XMM1_Db;
  undefined8 uVar11;
  Vector<float,_4> VVar12;
  Vec4 VVar13;
  tcu local_40 [16];
  
  uVar11 = CONCAT44(in_XMM1_Db,v);
  uVar5 = (access->m_size).m_data[0];
  uVar1 = (access->m_size).m_data[1];
  fVar9 = floorf(u);
  uVar6 = (int)fVar9 + offset->m_data[0];
  fVar9 = floorf(v);
  uVar8 = (int)fVar9 + offset->m_data[1];
  if (((sampler->wrapS == CLAMP_TO_BORDER) && ((int)uVar5 <= (int)uVar6 || (int)uVar6 < 0)) ||
     ((sampler->wrapT == CLAMP_TO_BORDER && ((int)uVar8 < 0 || (int)uVar1 <= (int)uVar8)))) {
    TVar2 = getTextureChannelClass((access->m_format).type);
    switch(TVar2) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      VVar12 = sampleTextureBorder<float>(this,&access->m_format,sampler);
      uVar11 = VVar12.m_data._8_8_;
      fVar9 = VVar12.m_data[0];
      fVar10 = VVar12.m_data[1];
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(local_40,&access->m_format,sampler);
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      lVar3 = 0;
      do {
        fVar10 = 0.0;
        fVar9 = (float)*(int *)(local_40 + lVar3 * 4);
        *(float *)(this + lVar3 * 4) = fVar9;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(local_40,&access->m_format,sampler);
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      lVar3 = 0;
      do {
        fVar10 = 0.0;
        fVar9 = (float)*(uint *)(local_40 + lVar3 * 4);
        *(float *)(this + lVar3 * 4) = fVar9;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      break;
    default:
      lVar3 = 0;
      do {
        *(undefined4 *)(this + lVar3 * 4) = 0xbf800000;
        lVar3 = lVar3 + 1;
        fVar9 = extraout_XMM0_Da;
        fVar10 = extraout_XMM0_Db;
      } while (lVar3 != 4);
    }
  }
  else {
    uVar7 = uVar6;
    j = 0;
    switch(sampler->wrapS) {
    case CLAMP_TO_EDGE:
    case MIRRORED_REPEAT_CL:
      uVar7 = uVar5 - 1;
      if ((int)uVar6 < (int)(uVar5 - 1)) {
        uVar7 = uVar6;
      }
      j = 0;
      if (-1 < (int)uVar6) {
        j = uVar7;
      }
      break;
    case CLAMP_TO_BORDER:
      if ((int)uVar6 < (int)uVar5) {
        uVar5 = uVar6;
      }
      j = 0xffffffff;
      if (-2 < (int)uVar6) {
        j = uVar5;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      j = ((int)uVar6 % (int)uVar5 >> 0x1f & uVar5) + (int)uVar6 % (int)uVar5;
      break;
    case MIRRORED_ONCE:
      uVar7 = uVar5;
      if ((int)uVar6 < (int)uVar5) {
        uVar7 = uVar6;
      }
      if (SBORROW4(uVar6,-uVar5) != (int)(uVar6 + uVar5) < 0) {
        uVar7 = -uVar5;
      }
    case MIRRORED_REPEAT_GL:
      iVar4 = (int)uVar7 % (int)(uVar5 * 2);
      uVar6 = (iVar4 - uVar5) + (iVar4 >> 0x1f & uVar5 * 2);
      j = ~((int)uVar6 >> 0x1f ^ uVar6) + uVar5;
    }
    uVar5 = uVar8;
    uVar6 = 0;
    switch(sampler->wrapT) {
    case CLAMP_TO_EDGE:
    case MIRRORED_REPEAT_CL:
      uVar5 = uVar1 - 1;
      if ((int)uVar8 < (int)(uVar1 - 1)) {
        uVar5 = uVar8;
      }
      uVar6 = 0;
      if (-1 < (int)uVar8) {
        uVar6 = uVar5;
      }
      break;
    case CLAMP_TO_BORDER:
      if ((int)uVar8 < (int)uVar1) {
        uVar1 = uVar8;
      }
      uVar6 = 0xffffffff;
      if (-2 < (int)uVar8) {
        uVar6 = uVar1;
      }
      break;
    case REPEAT_GL:
    case REPEAT_CL:
      uVar6 = ((int)uVar8 % (int)uVar1 >> 0x1f & uVar1) + (int)uVar8 % (int)uVar1;
      break;
    case MIRRORED_ONCE:
      uVar5 = uVar1;
      if ((int)uVar8 < (int)uVar1) {
        uVar5 = uVar8;
      }
      if (SBORROW4(uVar8,-uVar1) != (int)(uVar8 + uVar1) < 0) {
        uVar5 = -uVar1;
      }
    case MIRRORED_REPEAT_GL:
      iVar4 = (int)uVar5 % (int)(uVar1 * 2);
      uVar5 = (iVar4 - uVar1) + (iVar4 >> 0x1f & uVar1 * 2);
      uVar6 = ~((int)uVar5 >> 0x1f ^ uVar5) + uVar1;
    }
    VVar13 = lookup((ConstPixelBufferAccess *)this,(int)access,j,uVar6);
    uVar11 = VVar13.m_data._8_8_;
    fVar9 = VVar13.m_data[0];
    fVar10 = VVar13.m_data[1];
  }
  VVar13.m_data[1] = fVar10;
  VVar13.m_data[0] = fVar9;
  VVar13.m_data[2] = (float)(int)uVar11;
  VVar13.m_data[3] = (float)(int)((ulong)uVar11 >> 0x20);
  return (Vec4)VVar13.m_data;
}

Assistant:

static Vec4 sampleNearest2D (const ConstPixelBufferAccess& access, const Sampler& sampler, float u, float v, const IVec3& offset)
{
	int width	= access.getWidth();
	int height	= access.getHeight();

	int x = deFloorFloatToInt32(u)+offset.x();
	int y = deFloorFloatToInt32(v)+offset.y();

	// Check for CLAMP_TO_BORDER.
	if ((sampler.wrapS == Sampler::CLAMP_TO_BORDER && !deInBounds32(x, 0, width)) ||
		(sampler.wrapT == Sampler::CLAMP_TO_BORDER && !deInBounds32(y, 0, height)))
		return lookupBorder(access.getFormat(), sampler);

	int i = wrap(sampler.wrapS, x, width);
	int j = wrap(sampler.wrapT, y, height);

	return lookup(access, i, j, offset.z());
}